

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O2

void __thiscall
CoreML::NeuralNetworkShaper::shapePermuteLayer
          (NeuralNetworkShaper *this,NeuralNetworkLayer *specLayer)

{
  pointer pSVar1;
  RangeValue *pRVar2;
  size_t sVar3;
  size_t sVar4;
  undefined7 uVar5;
  bool bVar6;
  undefined7 uVar7;
  Type *pTVar8;
  mapped_type *pmVar9;
  ShapeRange *pSVar10;
  PermuteLayerParams *from;
  uint64 uVar11;
  uint64 uVar12;
  uint64 uVar13;
  uint64 uVar14;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  allocator_type local_91;
  mapped_type *local_90;
  vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_> ranges;
  vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_> outranges;
  PermuteLayerParams permute;
  
  pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                     (&(specLayer->input_).super_RepeatedPtrFieldBase,0);
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
           ::operator[](&this->blobShapes,pTVar8);
  std::vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>::vector
            (&ranges,4,(allocator_type *)&permute);
  pSVar10 = ShapeConstraint::sequenceRange(pmVar9);
  bVar6 = (pSVar10->_minimum)._isUnbound;
  uVar7 = *(undefined7 *)&(pSVar10->_minimum).field_0x1;
  sVar3 = (pSVar10->_minimum)._val;
  uVar5 = *(undefined7 *)&(pSVar10->_maximum).field_0x1;
  sVar4 = (pSVar10->_maximum)._val;
  ((ranges.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
    super__Vector_impl_data._M_start)->_maximum)._isUnbound = (pSVar10->_maximum)._isUnbound;
  *(undefined7 *)
   &((ranges.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
      super__Vector_impl_data._M_start)->_maximum).field_0x1 = uVar5;
  ((ranges.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
    super__Vector_impl_data._M_start)->_maximum)._val = sVar4;
  ((ranges.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
    super__Vector_impl_data._M_start)->_minimum)._isUnbound = bVar6;
  *(undefined7 *)
   &((ranges.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
      super__Vector_impl_data._M_start)->_minimum).field_0x1 = uVar7;
  ((ranges.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
    super__Vector_impl_data._M_start)->_minimum)._val = sVar3;
  pSVar10 = ShapeConstraint::channelRange(pmVar9);
  bVar6 = (pSVar10->_minimum)._isUnbound;
  uVar7 = *(undefined7 *)&(pSVar10->_minimum).field_0x1;
  sVar3 = (pSVar10->_minimum)._val;
  uVar5 = *(undefined7 *)&(pSVar10->_maximum).field_0x1;
  sVar4 = (pSVar10->_maximum)._val;
  ranges.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
  super__Vector_impl_data._M_start[1]._maximum._isUnbound = (pSVar10->_maximum)._isUnbound;
  *(undefined7 *)
   &ranges.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
    super__Vector_impl_data._M_start[1]._maximum.field_0x1 = uVar5;
  ranges.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
  super__Vector_impl_data._M_start[1]._maximum._val = sVar4;
  ranges.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
  super__Vector_impl_data._M_start[1]._minimum._isUnbound = bVar6;
  *(undefined7 *)
   &ranges.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
    super__Vector_impl_data._M_start[1]._minimum.field_0x1 = uVar7;
  ranges.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
  super__Vector_impl_data._M_start[1]._minimum._val = sVar3;
  pSVar10 = ShapeConstraint::heightRange(pmVar9);
  bVar6 = (pSVar10->_minimum)._isUnbound;
  uVar7 = *(undefined7 *)&(pSVar10->_minimum).field_0x1;
  sVar3 = (pSVar10->_minimum)._val;
  uVar5 = *(undefined7 *)&(pSVar10->_maximum).field_0x1;
  sVar4 = (pSVar10->_maximum)._val;
  ranges.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
  super__Vector_impl_data._M_start[2]._maximum._isUnbound = (pSVar10->_maximum)._isUnbound;
  *(undefined7 *)
   &ranges.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
    super__Vector_impl_data._M_start[2]._maximum.field_0x1 = uVar5;
  ranges.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
  super__Vector_impl_data._M_start[2]._maximum._val = sVar4;
  ranges.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
  super__Vector_impl_data._M_start[2]._minimum._isUnbound = bVar6;
  *(undefined7 *)
   &ranges.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
    super__Vector_impl_data._M_start[2]._minimum.field_0x1 = uVar7;
  ranges.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
  super__Vector_impl_data._M_start[2]._minimum._val = sVar3;
  pSVar10 = ShapeConstraint::widthRange(pmVar9);
  bVar6 = (pSVar10->_minimum)._isUnbound;
  uVar7 = *(undefined7 *)&(pSVar10->_minimum).field_0x1;
  sVar3 = (pSVar10->_minimum)._val;
  uVar5 = *(undefined7 *)&(pSVar10->_maximum).field_0x1;
  sVar4 = (pSVar10->_maximum)._val;
  ranges.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
  super__Vector_impl_data._M_start[3]._maximum._isUnbound = (pSVar10->_maximum)._isUnbound;
  *(undefined7 *)
   &ranges.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
    super__Vector_impl_data._M_start[3]._maximum.field_0x1 = uVar5;
  ranges.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
  super__Vector_impl_data._M_start[3]._maximum._val = sVar4;
  ranges.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
  super__Vector_impl_data._M_start[3]._minimum._isUnbound = bVar6;
  *(undefined7 *)
   &ranges.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
    super__Vector_impl_data._M_start[3]._minimum.field_0x1 = uVar7;
  ranges.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
  super__Vector_impl_data._M_start[3]._minimum._val = sVar3;
  local_90 = pmVar9;
  from = Specification::NeuralNetworkLayer::permute(specLayer);
  Specification::PermuteLayerParams::PermuteLayerParams(&permute,from);
  uVar11 = Specification::PermuteLayerParams::axis(&permute,0);
  uVar12 = Specification::PermuteLayerParams::axis(&permute,1);
  uVar13 = Specification::PermuteLayerParams::axis(&permute,2);
  uVar14 = Specification::PermuteLayerParams::axis(&permute,3);
  this_00 = &specLayer->output_;
  pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                     (&this_00->super_RepeatedPtrFieldBase,0);
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
           ::operator[](&this->blobShapes,pTVar8);
  pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                     (&this_00->super_RepeatedPtrFieldBase,0);
  ShapeConstraint::setName(pmVar9,pTVar8);
  pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                     (&this_00->super_RepeatedPtrFieldBase,0);
  ShapeConstraint::setName(pmVar9,pTVar8);
  ShapeConstraint::updateSequenceRange
            (pmVar9,ranges.
                    super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
                    _M_impl.super__Vector_impl_data._M_start + uVar11);
  ShapeConstraint::updateChannelRange
            (pmVar9,ranges.
                    super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
                    _M_impl.super__Vector_impl_data._M_start + uVar12);
  ShapeConstraint::updateHeightRange
            (pmVar9,ranges.
                    super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
                    _M_impl.super__Vector_impl_data._M_start + uVar13);
  ShapeConstraint::updateWidthRange
            (pmVar9,ranges.
                    super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
                    _M_impl.super__Vector_impl_data._M_start + uVar14);
  std::vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>::vector
            (&outranges,4,&local_91);
  pSVar10 = ShapeConstraint::sequenceRange(pmVar9);
  bVar6 = (pSVar10->_minimum)._isUnbound;
  uVar7 = *(undefined7 *)&(pSVar10->_minimum).field_0x1;
  sVar3 = (pSVar10->_minimum)._val;
  uVar5 = *(undefined7 *)&(pSVar10->_maximum).field_0x1;
  sVar4 = (pSVar10->_maximum)._val;
  pRVar2 = &outranges.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar11]._maximum;
  pRVar2->_isUnbound = (pSVar10->_maximum)._isUnbound;
  *(undefined7 *)&pRVar2->field_0x1 = uVar5;
  pRVar2->_val = sVar4;
  pSVar1 = outranges.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
           _M_impl.super__Vector_impl_data._M_start + uVar11;
  (pSVar1->_minimum)._isUnbound = bVar6;
  *(undefined7 *)&(pSVar1->_minimum).field_0x1 = uVar7;
  (pSVar1->_minimum)._val = sVar3;
  pSVar10 = ShapeConstraint::channelRange(pmVar9);
  bVar6 = (pSVar10->_minimum)._isUnbound;
  uVar7 = *(undefined7 *)&(pSVar10->_minimum).field_0x1;
  sVar3 = (pSVar10->_minimum)._val;
  uVar5 = *(undefined7 *)&(pSVar10->_maximum).field_0x1;
  sVar4 = (pSVar10->_maximum)._val;
  pRVar2 = &outranges.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar12]._maximum;
  pRVar2->_isUnbound = (pSVar10->_maximum)._isUnbound;
  *(undefined7 *)&pRVar2->field_0x1 = uVar5;
  pRVar2->_val = sVar4;
  pSVar1 = outranges.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
           _M_impl.super__Vector_impl_data._M_start + uVar12;
  (pSVar1->_minimum)._isUnbound = bVar6;
  *(undefined7 *)&(pSVar1->_minimum).field_0x1 = uVar7;
  (pSVar1->_minimum)._val = sVar3;
  pSVar10 = ShapeConstraint::heightRange(pmVar9);
  bVar6 = (pSVar10->_minimum)._isUnbound;
  uVar7 = *(undefined7 *)&(pSVar10->_minimum).field_0x1;
  sVar3 = (pSVar10->_minimum)._val;
  uVar5 = *(undefined7 *)&(pSVar10->_maximum).field_0x1;
  sVar4 = (pSVar10->_maximum)._val;
  pRVar2 = &outranges.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar13]._maximum;
  pRVar2->_isUnbound = (pSVar10->_maximum)._isUnbound;
  *(undefined7 *)&pRVar2->field_0x1 = uVar5;
  pRVar2->_val = sVar4;
  pSVar1 = outranges.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
           _M_impl.super__Vector_impl_data._M_start + uVar13;
  (pSVar1->_minimum)._isUnbound = bVar6;
  *(undefined7 *)&(pSVar1->_minimum).field_0x1 = uVar7;
  (pSVar1->_minimum)._val = sVar3;
  pSVar10 = ShapeConstraint::widthRange(pmVar9);
  bVar6 = (pSVar10->_minimum)._isUnbound;
  uVar7 = *(undefined7 *)&(pSVar10->_minimum).field_0x1;
  sVar3 = (pSVar10->_minimum)._val;
  uVar5 = *(undefined7 *)&(pSVar10->_maximum).field_0x1;
  sVar4 = (pSVar10->_maximum)._val;
  pRVar2 = &outranges.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar14]._maximum;
  pRVar2->_isUnbound = (pSVar10->_maximum)._isUnbound;
  *(undefined7 *)&pRVar2->field_0x1 = uVar5;
  pRVar2->_val = sVar4;
  pSVar1 = outranges.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
           _M_impl.super__Vector_impl_data._M_start + uVar14;
  (pSVar1->_minimum)._isUnbound = bVar6;
  *(undefined7 *)&(pSVar1->_minimum).field_0x1 = uVar7;
  (pSVar1->_minimum)._val = sVar3;
  ShapeConstraint::updateSequenceRange
            (local_90,outranges.
                      super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
                      _M_impl.super__Vector_impl_data._M_start);
  ShapeConstraint::updateChannelRange
            (local_90,outranges.
                      super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
                      _M_impl.super__Vector_impl_data._M_start + 1);
  ShapeConstraint::updateHeightRange
            (local_90,outranges.
                      super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
                      _M_impl.super__Vector_impl_data._M_start + 2);
  ShapeConstraint::updateWidthRange
            (local_90,outranges.
                      super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
                      _M_impl.super__Vector_impl_data._M_start + 3);
  pSVar10 = ShapeConstraint::batchRange(pmVar9);
  ShapeConstraint::updateBatchRange(local_90,pSVar10);
  std::_Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>::~_Vector_base
            (&outranges.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>)
  ;
  Specification::PermuteLayerParams::~PermuteLayerParams(&permute);
  std::_Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>::~_Vector_base
            (&ranges.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>);
  return;
}

Assistant:

void NeuralNetworkShaper::shapePermuteLayer(const Specification::NeuralNetworkLayer& specLayer) {

    //get the input shape
    ShapeConstraint& inputShape = blobShapes[specLayer.input(0)];

    std::vector<ShapeRange> ranges(4);
    ranges[0] = inputShape.sequenceRange();
    ranges[1] = inputShape.channelRange();
    ranges[2] = inputShape.heightRange();
    ranges[3] = inputShape.widthRange();

    Specification::PermuteLayerParams permute = specLayer.permute();
    size_t axis0 = static_cast<size_t>(permute.axis(0));
    size_t axis1 = static_cast<size_t>(permute.axis(1));
    size_t axis2 = static_cast<size_t>(permute.axis(2));
    size_t axis3 = static_cast<size_t>(permute.axis(3));

    ShapeConstraint& outputShape = blobShapes[specLayer.output(0)];
    outputShape.setName(specLayer.output(0));

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Permute layer " << specLayer.name() << " input shapes (before): " << std::endl;
    std::cout << inputShape;
    std::cout << "Permute layer " << specLayer.name() << " output shapes (before): " << std::endl;
    std::cout << outputShape;
#endif

    outputShape.setName(specLayer.output(0));
    outputShape.updateSequenceRange(ranges[axis0]);
    outputShape.updateChannelRange(ranges[axis1]);
    outputShape.updateHeightRange(ranges[axis2]);
    outputShape.updateWidthRange(ranges[axis3]);

    // Need for the reverse pass as well
    std::vector<ShapeRange> outranges(4);
    outranges[axis0] = outputShape.sequenceRange();
    outranges[axis1] = outputShape.channelRange();
    outranges[axis2] = outputShape.heightRange();
    outranges[axis3] = outputShape.widthRange();

    // Need the constraints to go both ways here
    inputShape.updateSequenceRange(outranges[0]);
    inputShape.updateChannelRange(outranges[1]);
    inputShape.updateHeightRange(outranges[2]);
    inputShape.updateWidthRange(outranges[3]);

    inputShape.updateBatchRange(outputShape.batchRange());

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Permute layer " << specLayer.name() << " input shapes (after): " << std::endl;
    std::cout << inputShape;
    std::cout << "Permute layer " << specLayer.name() << " output shapes (after): " << std::endl;
    std::cout << outputShape;
#endif
    
}